

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O1

void __thiscall
unodb::test::
tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
check_absent_keys<unsigned_long_long>
          (tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,initializer_list<unsigned_long_long> absent_keys)

{
  _Rb_tree_header *p_Var1;
  ulong *puVar2;
  ulong k;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  ulong *puVar5;
  char *message;
  internal local_50 [8];
  AssertionResult gtest_ar;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_38;
  
  puVar5 = absent_keys._M_array;
  if (absent_keys._M_len != 0) {
    puVar2 = puVar5 + absent_keys._M_len;
    p_Var1 = &(this->values)._M_t._M_impl.super__Rb_tree_header;
    do {
      k = *puVar5;
      p_Var3 = (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var4 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < k]) {
        if (*(ulong *)(p_Var3 + 1) >= k) {
          p_Var4 = p_Var3;
        }
      }
      local_38._M_node = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
         (local_38._M_node = p_Var4, k < *(ulong *)(p_Var4 + 1))) {
        local_38._M_node = &p_Var1->_M_header;
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )p_Var1;
      testing::internal::
      CmpHelperEQ<std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>>,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>>>
                (local_50,"(values.find(to_ikey(k)))","(values.cend())",&local_38,
                 (_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                  *)&gtest_ar.message_);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        if (gtest_ar._0_8_ == 0) {
          message = "";
        }
        else {
          message = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                   ,0x288,message);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
        if (local_38._M_node != (_Base_ptr)0x0) {
          (**(code **)(*(long *)local_38._M_node + 8))();
        }
        if (gtest_ar._0_8_ == 0) {
          return;
        }
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
        return;
      }
      if (gtest_ar._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
      }
      tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
      ::
      try_get<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unsigned_long>
                ((tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                  *)this,k);
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar2);
  }
  return;
}

Assistant:

void check_absent_keys(std::initializer_list<T> absent_keys) noexcept(
      noexcept(this->try_get(coerce_key(*absent_keys.begin())))) {
    for (const auto absent_key : absent_keys) {
      const auto k{coerce_key(absent_key)};
      UNODB_ASSERT_EQ(values.find(to_ikey(k)), values.cend());
      try_get(k);
    }
  }